

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMethodOptions
          (Parser *this,LocationRecorder *parent_location,FileDescriptorProto *containing_file,
          int optionsFieldNumber,Message *mutable_options)

{
  bool bVar1;
  allocator local_65;
  int local_64;
  FileDescriptorProto *local_60;
  Message *local_58;
  LocationRecorder location;
  
  local_64 = optionsFieldNumber;
  local_60 = containing_file;
  local_58 = mutable_options;
  ConsumeEndOfDeclaration(this,"{",parent_location);
  while( true ) {
    bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    if (bVar1) {
      return bVar1;
    }
    if ((this->input_->current_).type == TYPE_END) break;
    bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
    if (!bVar1) {
      LocationRecorder::LocationRecorder(&location,parent_location,local_64);
      bVar1 = ParseOption(this,local_58,&location,local_60,OPTION_STATEMENT);
      if (!bVar1) {
        SkipStatement(this);
      }
      LocationRecorder::~LocationRecorder(&location);
    }
  }
  std::__cxx11::string::string
            ((string *)&location,"Reached end of input in method options (missing \'}\').",&local_65
            );
  AddError(this,(string *)&location);
  std::__cxx11::string::~string((string *)&location);
  return bVar1;
}

Assistant:

bool Parser::ParseMethodOptions(const LocationRecorder& parent_location,
                                const FileDescriptorProto* containing_file,
                                const int optionsFieldNumber,
                                Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location, optionsFieldNumber);
      if (!ParseOption(mutable_options, location, containing_file,
                       OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}